

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBAttenuate(uint8 *src_argb,int src_stride_argb,uint8 *dst_argb,int dst_stride_argb,int width,
                 int height)

{
  int iVar1;
  code *local_40;
  _func_void_uint8_ptr_uint8_ptr_int *ARGBAttenuateRow;
  int y;
  int height_local;
  int width_local;
  int dst_stride_argb_local;
  uint8 *dst_argb_local;
  uint8 *puStack_18;
  int src_stride_argb_local;
  uint8 *src_argb_local;
  
  local_40 = ARGBAttenuateRow_C;
  if ((((src_argb == (uint8 *)0x0) || (dst_argb == (uint8 *)0x0)) || (width < 1)) || (height == 0))
  {
    src_argb_local._4_4_ = -1;
  }
  else {
    ARGBAttenuateRow._4_4_ = height;
    dst_argb_local._4_4_ = src_stride_argb;
    puStack_18 = src_argb;
    if (height < 0) {
      ARGBAttenuateRow._4_4_ = -height;
      puStack_18 = src_argb + (ARGBAttenuateRow._4_4_ + -1) * src_stride_argb;
      dst_argb_local._4_4_ = -src_stride_argb;
    }
    y = width;
    height_local = dst_stride_argb;
    if ((dst_argb_local._4_4_ == width << 2) && (dst_stride_argb == width << 2)) {
      y = ARGBAttenuateRow._4_4_ * width;
      ARGBAttenuateRow._4_4_ = 1;
      height_local = 0;
      dst_argb_local._4_4_ = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0x40);
    if ((iVar1 != 0) && (local_40 = ARGBAttenuateRow_Any_SSSE3, (y & 3U) == 0)) {
      local_40 = ARGBAttenuateRow_SSSE3;
    }
    iVar1 = libyuv::TestCpuFlag(0x400);
    if ((iVar1 != 0) && (local_40 = ARGBAttenuateRow_Any_AVX2, (y & 7U) == 0)) {
      local_40 = ARGBAttenuateRow_AVX2;
    }
    _width_local = dst_argb;
    for (ARGBAttenuateRow._0_4_ = 0; (int)ARGBAttenuateRow < ARGBAttenuateRow._4_4_;
        ARGBAttenuateRow._0_4_ = (int)ARGBAttenuateRow + 1) {
      (*local_40)(puStack_18,_width_local,y);
      puStack_18 = puStack_18 + dst_argb_local._4_4_;
      _width_local = _width_local + height_local;
    }
    src_argb_local._4_4_ = 0;
  }
  return src_argb_local._4_4_;
}

Assistant:

LIBYUV_API
int ARGBAttenuate(const uint8* src_argb,
                  int src_stride_argb,
                  uint8* dst_argb,
                  int dst_stride_argb,
                  int width,
                  int height) {
  int y;
  void (*ARGBAttenuateRow)(const uint8* src_argb, uint8* dst_argb, int width) =
      ARGBAttenuateRow_C;
  if (!src_argb || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  if (height < 0) {
    height = -height;
    src_argb = src_argb + (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb == width * 4 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBATTENUATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_SSSE3;
    if (IS_ALIGNED(width, 4)) {
      ARGBAttenuateRow = ARGBAttenuateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_ARGBATTENUATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_AVX2;
    if (IS_ALIGNED(width, 8)) {
      ARGBAttenuateRow = ARGBAttenuateRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBATTENUATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ARGBAttenuateRow = ARGBAttenuateRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBATTENUATEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      ARGBAttenuateRow = ARGBAttenuateRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGBAttenuateRow(src_argb, dst_argb, width);
    src_argb += src_stride_argb;
    dst_argb += dst_stride_argb;
  }
  return 0;
}